

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_MON_TIMED_INC(effect_handler_context_t_conflict *context)

{
  monster *mon_00;
  wchar_t local_34;
  monster *mon;
  wchar_t amount;
  effect_handler_context_t_conflict *context_local;
  
  if ((context->origin).what != SRC_MONSTER) {
    __assert_fail("context->origin.what == SRC_MONSTER",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effect-handler-general.c"
                  ,0x29c,"_Bool effect_handler_MON_TIMED_INC(effect_handler_context_t *)");
  }
  local_34 = effect_calculate_value(context,false);
  mon_00 = (monster *)cave_monster(cave,(context->origin).which.monster);
  if (mon_00 != (monster *)0x0) {
    if (local_34 < L'\0') {
      local_34 = L'\0';
    }
    mon_inc_timed(mon_00,context->subtype,local_34,L'\0');
    context->ident = true;
  }
  return true;
}

Assistant:

bool effect_handler_MON_TIMED_INC(effect_handler_context_t *context)
{
	assert(context->origin.what == SRC_MONSTER);

	int amount = effect_calculate_value(context, false);
	struct monster *mon = cave_monster(cave, context->origin.which.monster);

	if (mon) {
		mon_inc_timed(mon, context->subtype, MAX(amount, 0), 0);
		context->ident = true;
	}

	return true;
}